

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFileWrite(void *context,char *buffer,int len)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (buffer != (char *)0x0 && context != (void *)0x0) {
    sVar1 = fwrite(buffer,(long)len,1,(FILE *)context);
    if (((int)sVar1 == 0) && (iVar2 = ferror((FILE *)context), iVar2 != 0)) {
      __xmlIOErr(8,0,"fwrite()");
      return -1;
    }
    iVar2 = (int)sVar1 * len;
  }
  return iVar2;
}

Assistant:

static int
xmlFileWrite (void * context, const char * buffer, int len) {
    int items;

    if ((context == NULL) || (buffer == NULL))
        return(-1);
    items = fwrite(&buffer[0], len, 1, (FILE *) context);
    if ((items == 0) && (ferror((FILE *) context))) {
        xmlIOErr(0, "fwrite()");
	return(-1);
    }
    return(items * len);
}